

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_ftell.c
# Opt level: O0

zip_int64_t zip_ftell(zip_file_t *zf)

{
  zip_int64_t res;
  zip_file_t *zf_local;
  
  if (zf == (zip_file_t *)0x0) {
    zf_local = (zip_file_t *)0xffffffffffffffff;
  }
  else if ((zf->error).zip_err == 0) {
    zf_local = (zip_file_t *)zip_source_tell(zf->src);
    if ((long)zf_local < 0) {
      zip_error_set_from_source(&zf->error,zf->src);
      zf_local = (zip_file_t *)0xffffffffffffffff;
    }
  }
  else {
    zf_local = (zip_file_t *)0xffffffffffffffff;
  }
  return (zip_int64_t)zf_local;
}

Assistant:

ZIP_EXTERN zip_int64_t
zip_ftell(zip_file_t *zf) {
    zip_int64_t res;

    if (zf == NULL) {
        return -1;
    }

    if (zf->error.zip_err != 0) {
        return -1;
    }

    res = zip_source_tell(zf->src);
    if (res < 0) {
        zip_error_set_from_source(&zf->error, zf->src);
        return -1;
    }

    return res;
}